

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ck_seg.c
# Opt level: O0

int ck_seg(acmod_set_t *acmod_set,acmod_id_t *phone,uint32 n_phone,uint16 *seg,uint32 n_frame,
          char *utt_name)

{
  char *pcVar1;
  char *pcVar2;
  acmod_id_t aVar3;
  bool bVar4;
  uint local_50;
  uint32 n_state;
  uint32 f;
  acmod_id_t trans_ci;
  uint32 seg_ci;
  uint32 phone_i;
  char *utt_name_local;
  uint32 n_frame_local;
  uint16 *seg_local;
  uint32 n_phone_local;
  acmod_id_t *phone_local;
  acmod_set_t *acmod_set_local;
  
  if (n_phone == 0) {
    if (n_frame == 0) {
      acmod_set_local._4_4_ = 0;
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
              ,0x47,"utt %s: No phones, but non-empty seg exists\n");
      acmod_set_local._4_4_ = -1;
    }
  }
  else if ((*seg & 0x8000) == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
            ,0x4e,"utt %s: Expected beginning of phone indicator for at frame %u\n",utt_name,0);
    acmod_set_local._4_4_ = -1;
  }
  else {
    local_50 = 1;
    f = (uint32)(((ulong)*seg & 0xffffffff00007fff) / 0x13);
    n_state = acmod_set_base_phone(acmod_set,*phone);
    while( true ) {
      bVar4 = false;
      if (local_50 < n_frame) {
        bVar4 = (seg[local_50] & 0x8000) == 0;
      }
      trans_ci = 1;
      if (!bVar4) break;
      local_50 = local_50 + 1;
    }
    while( true ) {
      bVar4 = false;
      if ((f == n_state) && (bVar4 = false, local_50 < n_frame)) {
        bVar4 = trans_ci < n_phone;
      }
      if (!bVar4) break;
      f = (uint32)(((ulong)seg[local_50] & 0xffffffff00007fff) / 0x13);
      aVar3 = trans_ci + 1;
      n_state = acmod_set_base_phone(acmod_set,phone[trans_ci]);
      do {
        local_50 = local_50 + 1;
        bVar4 = false;
        if (local_50 < n_frame) {
          bVar4 = (seg[local_50] & 0x8000) == 0;
        }
        trans_ci = aVar3;
      } while (bVar4);
    }
    if (f == n_state) {
      if ((trans_ci < n_phone) && (local_50 == n_frame)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
                ,0x75,"utt_name %s: seg phone seq shorter than given phone seq\n",utt_name);
        acmod_set_local._4_4_ = -1;
      }
      else if ((trans_ci == n_phone) && (local_50 < n_frame)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
                ,0x7e,"utt_name %s: seg phone seq longer than given phone seq\n",utt_name);
        acmod_set_local._4_4_ = -1;
      }
      else {
        acmod_set_local._4_4_ = 0;
      }
    }
    else {
      pcVar1 = acmod_set_id2name(acmod_set,n_state);
      pcVar2 = acmod_set_id2name(acmod_set,f);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
              ,0x6d,
              "utt %s: phone %u, %s, in transcript does not match phone %s in seg at frame %u\n",
              utt_name,(ulong)(trans_ci - 1),pcVar1,pcVar2,local_50 - 1);
      acmod_set_local._4_4_ = -1;
    }
  }
  return acmod_set_local._4_4_;
}

Assistant:

int
ck_seg(acmod_set_t *acmod_set,
       acmod_id_t *phone,
       uint32 n_phone,
       uint16 *seg,
       uint32 n_frame,
       const char *utt_name)
{
    uint32	phone_i;
    uint32	seg_ci;
    acmod_id_t	trans_ci;
    uint32 f;
    uint32 n_state = MAX_N_STATE-1;	/* # of emitting states/model */

    if (n_phone == 0) {
	if (n_frame == 0) 
	    return S3_SUCCESS;
	else {
	    E_ERROR("utt %s: No phones, but non-empty seg exists\n");
	    return S3_ERROR;
	}
    }

    if ((seg[0] & 0x8000) == 0) {
	E_ERROR("utt %s: Expected beginning of phone indicator for at frame %u\n",
		utt_name, 0);

	return S3_ERROR;
    }

    phone_i = 0;
    f = 0;

    seg_ci = (seg[f++] & 0x7FFF) / n_state;
    trans_ci = acmod_set_base_phone(acmod_set, phone[phone_i++]);
    /* skip over non-begin frames */
    for (; ((f < n_frame) && ((seg[f] & 0x8000) == 0)); f++);

    while ((seg_ci == trans_ci) &&
	   (f < n_frame) &&
	   (phone_i < n_phone)) {
	
	seg_ci = (seg[f++] & 0x7FFF) / n_state;
	
	trans_ci = acmod_set_base_phone(acmod_set, phone[phone_i++]);
	
	/* skip over non-begin frames */
	for (; ((f < n_frame ) && ((seg[f] & 0x8000) == 0)); f++);
    }

    if (seg_ci != trans_ci) {
	E_ERROR("utt %s: phone %u, %s, in transcript does not match phone %s in seg at frame %u\n",
		utt_name,
		phone_i-1,
		acmod_set_id2name(acmod_set, trans_ci),
		acmod_set_id2name(acmod_set, seg_ci),
		f-1);
	
	return S3_ERROR;
    }

    if ((phone_i < n_phone) && (f == n_frame)) {
	/* i.e. got to end of seg sequence before end of phone seq */
	E_ERROR("utt_name %s: seg phone seq shorter than given phone seq\n",
		utt_name);
	
	return S3_ERROR;
    }

    if ((phone_i == n_phone) && (f < n_frame)) {
	/* i.e. got to end of phone sequence before end of seg seq */

	E_ERROR("utt_name %s: seg phone seq longer than given phone seq\n",
		utt_name);
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}